

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<std::__cxx11::string,8ul>::SmallVector<char_const*>
          (SmallVector<std::__cxx11::string,8ul> *this,char **arg_list_begin,char **arg_list_end)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  allocator local_31;
  ulong local_30;
  size_t i;
  size_t count;
  char **arg_list_end_local;
  char **arg_list_begin_local;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_local;
  
  count = (size_t)arg_list_end;
  arg_list_end_local = arg_list_begin;
  arg_list_begin_local = (char **)this;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)this);
  i = (long)(count - (long)arg_list_end_local) >> 3;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::reserve((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)this,i);
  for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
    lVar1 = *(long *)this;
    lVar3 = local_30 * 0x20;
    pcVar2 = *arg_list_end_local;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)(lVar1 + lVar3),pcVar2,&local_31);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
    arg_list_end_local = arg_list_end_local + 1;
  }
  *(size_t *)(this + 8) = i;
  return;
}

Assistant:

SmallVector(const U *arg_list_begin, const U *arg_list_end) SPIRV_CROSS_NOEXCEPT : SmallVector()
	{
		auto count = size_t(arg_list_end - arg_list_begin);
		reserve(count);
		for (size_t i = 0; i < count; i++, arg_list_begin++)
			new (&this->ptr[i]) T(*arg_list_begin);
		this->buffer_size = count;
	}